

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal.hpp
# Opt level: O2

unsigned_long
duckdb::TryCastDecimalCInternal<unsigned_long>(duckdb_result *source,idx_t col,idx_t row)

{
  bool bVar1;
  unsigned_long in_RAX;
  unsigned_long result_value;
  unsigned_long local_8;
  
  local_8 = in_RAX;
  bVar1 = CastDecimalCInternal<unsigned_long>(source,&local_8,col,row);
  if (!bVar1) {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

RESULT_TYPE TryCastDecimalCInternal(duckdb_result *source, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!CastDecimalCInternal<RESULT_TYPE>(source, result_value, col, row)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}